

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  pointer pRVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  pointer pRVar11;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1d8 [15];
  char local_1c9;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  if (this->UseCTestLaunch != false) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Line: [",7);
  if (data == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar7 = strlen(data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x441,(char *)local_1c8,(this->super_cmCTestGenericHandler).Quiet);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  local_1c9 = true;
  if (this->ErrorQuotaReached == false) {
    pRVar11 = (this->ErrorMatchRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->ErrorMatchRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = false;
    if (pRVar11 != pRVar2) {
      lVar10 = 8;
      do {
        bVar5 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Error Line: ",0xe);
          if (data == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30)
            ;
          }
          else {
            sVar7 = strlen(data);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (matches: ",0xb)
          ;
          pbVar3 = (this->CustomErrorMatches).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)((long)pbVar3 + lVar10 + -8),
                              *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x452,(char *)local_1c8,(this->super_cmCTestGenericHandler).Quiet);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar4 = true;
          break;
        }
        pRVar11 = pRVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (pRVar11 != pRVar2);
    }
    pRVar11 = (this->ErrorExceptionRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->ErrorExceptionRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar11 != pRVar2) {
      lVar10 = 8;
      do {
        bVar5 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Not an error Line: ",0x15);
          if (data == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30)
            ;
          }
          else {
            sVar7 = strlen(data);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (matches: ",0xb)
          ;
          pbVar3 = (this->CustomErrorExceptions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)((long)pbVar3 + lVar10 + -8),
                              *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x461,(char *)local_1c8,(this->super_cmCTestGenericHandler).Quiet);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar4 = false;
          break;
        }
        pRVar11 = pRVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (pRVar11 != pRVar2);
    }
    local_1c9 = !bVar4;
  }
  if (this->WarningQuotaReached == false) {
    pRVar11 = (this->WarningMatchRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->WarningMatchRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = true;
    if (pRVar11 != pRVar2) {
      lVar10 = 8;
      do {
        bVar5 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Warning Line: ",0x10);
          if (data == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30)
            ;
          }
          else {
            sVar7 = strlen(data);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (matches: ",0xb)
          ;
          pbVar3 = (this->CustomWarningMatches).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)((long)pbVar3 + lVar10 + -8),
                              *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x472,(char *)local_1c8,(this->super_cmCTestGenericHandler).Quiet);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar4 = false;
          break;
        }
        pRVar11 = pRVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (pRVar11 != pRVar2);
    }
    pRVar11 = (this->WarningExceptionRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->WarningExceptionRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar11 != pRVar2) {
      lVar10 = 8;
      do {
        bVar5 = cmsys::RegularExpression::find(pRVar11,data,&pRVar11->regmatch);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Not a warning Line: ",0x16);
          if (data == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30)
            ;
          }
          else {
            sVar7 = strlen(data);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,data,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (matches: ",0xb)
          ;
          pbVar3 = (this->CustomWarningExceptions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)((long)pbVar3 + lVar10 + -8),
                              *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x482,(char *)local_1c8,(this->super_cmCTestGenericHandler).Quiet);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          goto LAB_0016627e;
        }
        pRVar11 = pRVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (pRVar11 != pRVar2);
    }
    iVar9 = 1;
    if (!bVar4) goto LAB_00166280;
  }
LAB_0016627e:
  iVar9 = 0;
LAB_00166280:
  iVar6 = 2;
  if (local_1c9 != '\0') {
    iVar6 = iVar9;
  }
  return iVar6;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << data << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(data)) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << data << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(data)) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << data << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(data)) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(data)) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}